

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_input * fy_node_get_input(fy_node *fyn)

{
  _Bool _Var1;
  fy_input *local_28;
  fy_input *fyi;
  fy_node *fyn_local;
  
  local_28 = fy_node_get_first_input(fyn);
  if (local_28 == (fy_input *)0x0) {
    fyn_local = (fy_node *)0x0;
  }
  else {
    _Var1 = fy_node_uses_single_input_only(fyn,local_28);
    if (!_Var1) {
      local_28 = (fy_input *)0x0;
    }
    fyn_local = (fy_node *)local_28;
  }
  return (fy_input *)fyn_local;
}

Assistant:

struct fy_input *fy_node_get_input(struct fy_node *fyn) {
    struct fy_input *fyi = NULL;

    fyi = fy_node_get_first_input(fyn);
    if (!fyi)
        return NULL;

    return fy_node_uses_single_input_only(fyn, fyi) ? fyi : NULL;
}